

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileCollider.cpp
# Opt level: O3

Position __thiscall
solitaire::colliders::TableauPileCollider::getRelativeCardPosition
          (TableauPileCollider *this,uint index,uint topCoveredCardPosition)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = index;
  if (topCoveredCardPosition < index) {
    uVar2 = topCoveredCardPosition;
  }
  uVar1 = index * 0x10 + uVar2 * 3 + topCoveredCardPosition * -0x10;
  if (index <= topCoveredCardPosition) {
    uVar1 = uVar2 * 3;
  }
  return (Position)((ulong)uVar1 << 0x20);
}

Assistant:

Position TableauPileCollider::getRelativeCardPosition(
    const unsigned index, const unsigned topCoveredCardPosition) const
{
    int y = 0;
    for (unsigned i = 0; i < topCoveredCardPosition and i < index; ++i)
        y += Layout::coveredTableauPileCardsSpacing;
    for (unsigned i = topCoveredCardPosition; i < index; ++i)
        y += Layout::uncoveredTableauPileCardsSpacing;
    return Position {0, y};
}